

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.hpp
# Opt level: O0

void __thiscall
websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::init_asio
          (endpoint<websocketpp::config::asio::transport_config> *this,io_service_ptr ptr,
          error_code *ec)

{
  element_type *this_00;
  element_type *this_01;
  size_t in_RCX;
  undefined8 *in_RDX;
  service_registry *in_RSI;
  io_context *in_RDI;
  error_code eVar1;
  error_code *in_stack_ffffffffffffffb0;
  undefined8 local_48;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  if (*(int *)&in_RDI[0xe].impl_ == 0) {
    this_01 = std::
              __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2bcfe7);
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              (this_01,0x400,"asio::init_asio",in_RCX);
    in_RDI[8].super_execution_context.service_registry_ = in_RSI;
    *(undefined1 *)&in_RDI[8].impl_ = 1;
    std::ref<asio::io_context>(in_RDI);
    std::
    make_shared<asio::basic_socket_acceptor<asio::ip::tcp>,std::reference_wrapper<asio::io_context>>
              ((reference_wrapper<asio::io_context> *)
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    std::shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>_>::operator=
              ((shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>_> *)in_stack_ffffffffffffffb0,
               (shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>_> *)in_RDI);
    std::shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>_>::~shared_ptr
              ((shared_ptr<asio::basic_socket_acceptor<asio::ip::tcp>_> *)0x2bd051);
    *(undefined4 *)&in_RDI[0xe].impl_ = 1;
    std::error_code::error_code(in_stack_ffffffffffffffb0);
    *in_RDX = in_stack_ffffffffffffffb0;
    in_RDX[1] = local_48;
  }
  else {
    this_00 = std::
              __shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2bcf95);
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
              (this_00,2,"asio::init_asio called from the wrong state",in_RCX);
    eVar1 = websocketpp::error::make_error_code(0);
    *in_RDX = CONCAT44(in_stack_ffffffffffffffdc,eVar1._M_value);
    in_RDX[1] = eVar1._M_cat;
  }
  return;
}

Assistant:

void init_asio(io_service_ptr ptr, lib::error_code & ec) {
        if (m_state != UNINITIALIZED) {
            m_elog->write(log::elevel::library,
                "asio::init_asio called from the wrong state");
            using websocketpp::error::make_error_code;
            ec = make_error_code(websocketpp::error::invalid_state);
            return;
        }

        m_alog->write(log::alevel::devel,"asio::init_asio");

        m_io_service = ptr;
        m_external_io_service = true;
        m_acceptor = lib::make_shared<lib::asio::ip::tcp::acceptor>(
            lib::ref(*m_io_service));

        m_state = READY;
        ec = lib::error_code();
    }